

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QByteArray * formatConnectionSignature(char *className,QMetaMethod *method)

{
  int iVar1;
  QByteArray *this;
  qsizetype qVar2;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  bool hasParameters;
  int openParen;
  QByteArray *result;
  QByteArray signature;
  undefined7 in_stack_fffffffffffffe58;
  char in_stack_fffffffffffffe5f;
  undefined7 in_stack_fffffffffffffe60;
  char in_stack_fffffffffffffe67;
  QStringBuilder<const_char_(&)[11],_QByteArray> *in_stack_fffffffffffffe68;
  QStringBuilder<const_char_*&,_QByteArray> *a;
  undefined7 in_stack_fffffffffffffe88;
  bool bVar3;
  undefined1 uVar4;
  QByteArray *len;
  QByteArray *pos;
  QStringBuilder<const_char_*&,_QByteArray> local_110 [7];
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pos = &local_28;
  len = in_RDI;
  QMetaMethod::methodSignature((QMetaMethod *)in_stack_fffffffffffffe68);
  this = (QByteArray *)
         QByteArray::indexOf((QByteArray *)in_stack_fffffffffffffe68,in_stack_fffffffffffffe67,
                             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  iVar1 = (int)this;
  bVar3 = false;
  if (-1 < iVar1) {
    qVar2 = QByteArray::size(&local_28);
    bVar3 = (long)iVar1 < qVar2 + -2;
  }
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  uVar4 = bVar3;
  QByteArray::QByteArray((QByteArray *)0x3fad45);
  if (bVar3 != false) {
    QByteArray::size(&local_28);
    QByteArray::mid(this,(qsizetype)pos,(qsizetype)len);
    operator+((char (*) [11])in_stack_fffffffffffffe68,
              (QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    operator+(in_stack_fffffffffffffe68,
              (char (*) [3])CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    operator+=((QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[3]> *)
               CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[3]>::
    ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[3]>
                     *)0x3fadf4);
    QStringBuilder<const_char_(&)[11],_QByteArray>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[11],_QByteArray> *)0x3fae01);
    QByteArray::~QByteArray((QByteArray *)0x3fae0e);
  }
  QByteArray::operator+=
            ((QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe5f);
  a = local_110;
  QArrayDataPointer<char>::QArrayDataPointer((QArrayDataPointer<char> *)a,(Data *)0x0,"::",2);
  QByteArray::QByteArray
            ((QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (DataPointer *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  operator+((char **)a,(QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  QMetaMethod::name((QMetaMethod *)CONCAT17(uVar4,in_stack_fffffffffffffe88));
  operator+(a,(QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  operator+=((QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray> *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<const_char_*&,_QByteArray>,_QByteArray> *)
             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  QByteArray::~QByteArray((QByteArray *)0x3faf6e);
  QStringBuilder<const_char_*&,_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_*&,_QByteArray> *)0x3faf7b);
  QByteArray::~QByteArray((QByteArray *)0x3faf88);
  QArrayDataPointer<char>::~QArrayDataPointer
            ((QArrayDataPointer<char> *)
             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  if (bVar3 != false) {
    QByteArray::operator+=
              ((QByteArray *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe5f);
  }
  QByteArray::~QByteArray((QByteArray *)0x3fb081);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return len;
}

Assistant:

static QByteArray formatConnectionSignature(const char *className, const QMetaMethod &method)
{
    const auto signature = method.methodSignature();
    Q_ASSERT(signature.endsWith(')'));
    const int openParen = signature.indexOf('(');
    const bool hasParameters = openParen >= 0 && openParen < signature.size() - 2;
    QByteArray result;
    if (hasParameters) {
        result += "qOverload<"
            + signature.mid(openParen + 1, signature.size() - openParen - 2) + ">(";
    }
    result += '&';
    result += className + QByteArrayLiteral("::") + method.name();
    if (hasParameters)
        result += ')';
    return result;
}